

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall test_ethash_io_memo_file_match::test_method(test_ethash_io_memo_file_match *this)

{
  ethash_h256_t seed_hash;
  ethash_h256_t seedhash;
  bool bVar1;
  ethash_io_rc eVar2;
  ethash_light_t light;
  ethash_full_t full;
  FILE *f;
  char *local_158;
  char *local_150;
  shared_count sStack_148;
  ethash_light_t local_140;
  path local_138;
  undefined **local_118;
  ulong local_110;
  shared_count sStack_108;
  char **local_100;
  ethash_h256_t seed;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  builtin_memcpy(seed.b,"~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~",0x20);
  light = ethash_light_new_internal(0x400,&seed);
  seed_hash.b[8] = seed.b[8];
  seed_hash.b[9] = seed.b[9];
  seed_hash.b[10] = seed.b[10];
  seed_hash.b[0xb] = seed.b[0xb];
  seed_hash.b[0xc] = seed.b[0xc];
  seed_hash.b[0xd] = seed.b[0xd];
  seed_hash.b[0xe] = seed.b[0xe];
  seed_hash.b[0xf] = seed.b[0xf];
  seed_hash.b[0] = seed.b[0];
  seed_hash.b[1] = seed.b[1];
  seed_hash.b[2] = seed.b[2];
  seed_hash.b[3] = seed.b[3];
  seed_hash.b[4] = seed.b[4];
  seed_hash.b[5] = seed.b[5];
  seed_hash.b[6] = seed.b[6];
  seed_hash.b[7] = seed.b[7];
  seed_hash.b[0x10] = seed.b[0x10];
  seed_hash.b[0x11] = seed.b[0x11];
  seed_hash.b[0x12] = seed.b[0x12];
  seed_hash.b[0x13] = seed.b[0x13];
  seed_hash.b[0x14] = seed.b[0x14];
  seed_hash.b[0x15] = seed.b[0x15];
  seed_hash.b[0x16] = seed.b[0x16];
  seed_hash.b[0x17] = seed.b[0x17];
  seed_hash.b[0x18] = seed.b[0x18];
  seed_hash.b[0x19] = seed.b[0x19];
  seed_hash.b[0x1a] = seed.b[0x1a];
  seed_hash.b[0x1b] = seed.b[0x1b];
  seed_hash.b[0x1c] = seed.b[0x1c];
  seed_hash.b[0x1d] = seed.b[0x1d];
  seed_hash.b[0x1e] = seed.b[0x1e];
  seed_hash.b[0x1f] = seed.b[0x1f];
  full = ethash_full_new_internal
                   ("./test_ethash_directory/",seed_hash,0x8000,light,(ethash_callback_t)0x0);
  if (full != (ethash_full_t)0x0) {
    local_40 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_38 = "";
    local_50 = &boost::unit_test::basic_cstring<char_const>::null;
    local_48 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xfe);
    boost::filesystem::path::path(&local_138,"./test_ethash_directory/");
    bVar1 = boost::filesystem::is_directory(&local_138);
    local_158 = (char *)CONCAT71(local_158._1_7_,bVar1);
    local_150 = (char *)0x0;
    sStack_148.pi_ = (sp_counted_base *)0x0;
    local_100 = &local_60;
    local_60 = "fs::is_directory(fs::path(\"./test_ethash_directory/\"))";
    local_58 = "";
    local_110 = local_110 & 0xffffffffffffff00;
    local_118 = &PTR__lazy_ostream_0013b118;
    sStack_108.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_70 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_68 = "";
    local_140 = light;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_148);
    std::__cxx11::string::~string((string *)&local_138);
    ethash_full_delete(full);
    local_80 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_78 = "";
    local_90 = &boost::unit_test::basic_cstring<char_const>::null;
    local_88 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x105);
    local_138.m_pathname._M_string_length._0_1_ = 0;
    local_138.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013aa18;
    local_138.m_pathname.field_2._M_allocated_capacity =
         (size_type)&boost::unit_test::lazy_ostream::inst;
    local_138.m_pathname.field_2._8_8_ = (long)"\"\n" + 2;
    local_a0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_98 = "";
    local_118 = (undefined **)CONCAT44(local_118._4_4_,3);
    seedhash.b[8] = seed.b[8];
    seedhash.b[9] = seed.b[9];
    seedhash.b[10] = seed.b[10];
    seedhash.b[0xb] = seed.b[0xb];
    seedhash.b[0xc] = seed.b[0xc];
    seedhash.b[0xd] = seed.b[0xd];
    seedhash.b[0xe] = seed.b[0xe];
    seedhash.b[0xf] = seed.b[0xf];
    seedhash.b[0] = seed.b[0];
    seedhash.b[1] = seed.b[1];
    seedhash.b[2] = seed.b[2];
    seedhash.b[3] = seed.b[3];
    seedhash.b[4] = seed.b[4];
    seedhash.b[5] = seed.b[5];
    seedhash.b[6] = seed.b[6];
    seedhash.b[7] = seed.b[7];
    seedhash.b[0x10] = seed.b[0x10];
    seedhash.b[0x11] = seed.b[0x11];
    seedhash.b[0x12] = seed.b[0x12];
    seedhash.b[0x13] = seed.b[0x13];
    seedhash.b[0x14] = seed.b[0x14];
    seedhash.b[0x15] = seed.b[0x15];
    seedhash.b[0x16] = seed.b[0x16];
    seedhash.b[0x17] = seed.b[0x17];
    seedhash.b[0x18] = seed.b[0x18];
    seedhash.b[0x19] = seed.b[0x19];
    seedhash.b[0x1a] = seed.b[0x1a];
    seedhash.b[0x1b] = seed.b[0x1b];
    seedhash.b[0x1c] = seed.b[0x1c];
    seedhash.b[0x1d] = seed.b[0x1d];
    seedhash.b[0x1e] = seed.b[0x1e];
    seedhash.b[0x1f] = seed.b[0x1f];
    eVar2 = ethash_io_prepare("./test_ethash_directory/",seedhash,&f,0x8000,false);
    local_158 = (char *)CONCAT44(local_158._4_4_,eVar2);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ethash_io_rc,ethash_io_rc>
              (&local_138,&local_a0,0x105,2,2,&local_118,"ETHASH_IO_MEMO_MATCH",&local_158,
               "ethash_io_prepare(\"./test_ethash_directory/\", seed, &f, full_size, false)");
    local_b0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_a8 = "";
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x106);
    local_118 = (undefined **)CONCAT71(local_118._1_7_,f != (FILE *)0x0);
    local_110 = 0;
    sStack_108.pi_ = (sp_counted_base *)0x0;
    local_158 = "f";
    local_150 = "";
    local_138.m_pathname._M_string_length._0_1_ = 0;
    local_138.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013b118;
    local_138.m_pathname.field_2._M_allocated_capacity =
         (size_type)&boost::unit_test::lazy_ostream::inst;
    local_138.m_pathname.field_2._8_8_ = &local_158;
    local_d0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_c8 = "";
    boost::test_tools::tt_detail::report_assertion(&local_118,&local_138,&local_d0,0x106,2,0,0);
    boost::detail::shared_count::~shared_count(&sStack_108);
    fclose((FILE *)f);
    ethash_light_delete(local_140);
    boost::filesystem::path::path(&local_138,"./test_ethash_directory/");
    boost::filesystem::remove_all(&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    return;
  }
  __assert_fail("full",
                "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
                ,0xfc,"void test_ethash_io_memo_file_match::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ethash_io_memo_file_match) {
	uint64_t full_size;
	uint64_t cache_size;
	ethash_h256_t seed;
	ethash_h256_t hash;
	FILE* f;
	memcpy(&seed, "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);
	memcpy(&hash, "~~~X~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);

	cache_size = 1024;
	full_size = 1024 * 32;

	ethash_light_t light = ethash_light_new_internal(cache_size, &seed);
	ethash_full_t full = ethash_full_new_internal(
		"./test_ethash_directory/",
		seed,
		full_size,
		light,
		NULL
	);
	BOOST_ASSERT(full);
	// let's make sure that the directory was created
	BOOST_REQUIRE(fs::is_directory(fs::path("./test_ethash_directory/")));
	// delete the full here so that memory is properly unmapped and FILE handler freed
	ethash_full_delete(full);
	// and check that we have a match when checking again
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_MATCH,
		ethash_io_prepare("./test_ethash_directory/", seed, &f, full_size, false)
	);
	BOOST_REQUIRE(f);

	// cleanup
	fclose(f);
	ethash_light_delete(light);
	fs::remove_all("./test_ethash_directory/");
}